

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *
soul::AST::CommaSeparatedList::getAsExpressionList
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
           *__return_storage_ptr__,pool_ptr<soul::AST::Expression> *expressionOrList)

{
  Expression *pEVar1;
  size_t sVar2;
  long lVar3;
  
  if (expressionOrList->object == (Expression *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(expressionOrList->object,&Expression::typeinfo,&typeinfo,0);
  }
  if (lVar3 == 0) {
    __return_storage_ptr__->items = (pool_ref<soul::AST::Expression> *)__return_storage_ptr__->space
    ;
    __return_storage_ptr__->numActive = 0;
    __return_storage_ptr__->numAllocated = 4;
    pEVar1 = expressionOrList->object;
    if (pEVar1 != (Expression *)0x0) {
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                (__return_storage_ptr__,1);
      sVar2 = __return_storage_ptr__->numActive;
      __return_storage_ptr__->items[sVar2].object = pEVar1;
      __return_storage_ptr__->numActive = sVar2 + 1;
    }
  }
  else {
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::ArrayWithPreallocation
              (__return_storage_ptr__,
               (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(lVar3 + 0x30))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

static auto getAsExpressionList (pool_ptr<Expression> expressionOrList)
        {
            if (auto csl = cast<CommaSeparatedList> (expressionOrList))
                return csl->items;

            decltype(CommaSeparatedList::items) list;

            if (expressionOrList != nullptr)
                list.push_back (*expressionOrList);

            return list;
        }